

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImGuiNavLayer IVar9;
  ImGuiID IVar10;
  uint uVar11;
  ImGuiWindow *pIVar12;
  ImGuiWindow *pIVar13;
  ImRect cand;
  ImRect cand_00;
  ImVec2 IVar14;
  uint uVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  bool bVar18;
  ImGuiNavMoveResult *result;
  ImGuiContext *g;
  ImGui *this;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar16 = GImGui;
  pIVar12 = GImGui->CurrentWindow;
  if (id == 0) goto LAB_0011b89e;
  IVar9 = (pIVar12->DC).NavLayerCurrent;
  piVar1 = &(pIVar12->DC).NavLayerActiveMaskNext;
  *piVar1 = *piVar1 | 1 << ((byte)IVar9 & 0x1f);
  IVar10 = pIVar16->NavId;
  if ((((IVar10 != id) && (pIVar16->NavAnyRequest != true)) ||
      (pIVar13 = pIVar16->NavWindow, pIVar13->RootWindowForNav != pIVar12->RootWindowForNav)) ||
     ((pIVar12 != pIVar13 && (((uint)(pIVar13->Flags | pIVar12->Flags) >> 0x17 & 1) == 0))))
  goto LAB_0011b89e;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar11 = (pIVar12->DC).ItemFlags;
  uVar7 = ((ImGuiNavMoveResult *)nav_bb_arg)->ID;
  uVar8 = ((ImGuiNavMoveResult *)nav_bb_arg)->FocusScopeId;
  fVar19 = (pIVar12->Pos).x;
  fVar23 = SUB84(((ImGuiNavMoveResult *)nav_bb_arg)->Window,0) - fVar19;
  fVar20 = (pIVar12->Pos).y;
  fVar24 = (float)((ulong)((ImGuiNavMoveResult *)nav_bb_arg)->Window >> 0x20) - fVar20;
  fVar19 = (float)uVar7 - fVar19;
  fVar20 = (float)uVar8 - fVar20;
  if ((pIVar16->NavInitRequest == true) && (pIVar16->NavLayer == IVar9)) {
    if ((uVar11 & 0x10) == 0) {
      pIVar16->NavInitResultId = id;
      (pIVar16->NavInitResultRectRel).Min.x = fVar23;
      (pIVar16->NavInitResultRectRel).Min.y = fVar24;
      (pIVar16->NavInitResultRectRel).Max.x = fVar19;
      (pIVar16->NavInitResultRectRel).Max.y = fVar20;
      pIVar16->NavInitRequest = false;
      pIVar16->NavAnyRequest = pIVar16->NavMoveRequest;
    }
    else if (pIVar16->NavInitResultId == 0) {
      pIVar16->NavInitResultId = id;
      (pIVar16->NavInitResultRectRel).Min.x = fVar23;
      (pIVar16->NavInitResultRectRel).Min.y = fVar24;
      (pIVar16->NavInitResultRectRel).Max.x = fVar19;
      (pIVar16->NavInitResultRectRel).Max.y = fVar20;
    }
  }
  uVar15 = uVar11;
  if (IVar10 == id) {
    if ((pIVar16->NavMoveRequestFlags & 0x10) != 0) {
      uVar15 = uVar11 & 0xc;
      goto joined_r0x0011b9bc;
    }
  }
  else {
joined_r0x0011b9bc:
    if ((uVar11 & 0xc) == 0) {
      this = (ImGui *)&pIVar16->NavMoveResultOther;
      if (pIVar12 == pIVar13) {
        this = (ImGui *)&pIVar16->NavMoveResultLocal;
      }
      if ((pIVar16->NavMoveRequest == true) &&
         (cand.Min = (ImVec2)((ImGuiNavMoveResult *)nav_bb_arg)->Window,
         cand.Max.x = (float)((ImGuiNavMoveResult *)nav_bb_arg)->ID,
         cand.Max.y = (float)((ImGuiNavMoveResult *)nav_bb_arg)->FocusScopeId,
         bVar17 = NavScoreItem(this,(ImGuiNavMoveResult *)(ulong)uVar15,cand), bVar17)) {
        *(ImGuiWindow **)this = pIVar12;
        *(ImGuiID *)(this + 8) = id;
        *(ImGuiID *)(this + 0xc) = (pIVar12->DC).NavFocusScopeIdCurrent;
        *(float *)(this + 0x1c) = fVar23;
        *(float *)(this + 0x20) = fVar24;
        *(float *)(this + 0x24) = fVar19;
        *(float *)(this + 0x28) = fVar20;
      }
      if (((pIVar16->NavMoveRequestFlags & 0x20) != 0) &&
         (result = (ImGuiNavMoveResult *)nav_bb_arg,
         bVar17 = ImRect::Overlaps(&pIVar12->ClipRect,nav_bb_arg), bVar17)) {
        fVar4 = *(float *)((long)&((ImGuiNavMoveResult *)nav_bb_arg)->Window + 4);
        fVar5 = (float)((ImGuiNavMoveResult *)nav_bb_arg)->FocusScopeId;
        fVar6 = (pIVar12->ClipRect).Min.y;
        fVar21 = (pIVar12->ClipRect).Max.y;
        fVar22 = fVar21;
        if (fVar5 <= fVar21) {
          fVar22 = fVar5;
        }
        if (fVar4 <= fVar21) {
          fVar21 = fVar4;
        }
        if (((fVar5 - fVar4) * 0.7 <=
             (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 | ~-(uint)(fVar5 < fVar6) & (uint)fVar22)
             - (float)(-(uint)(fVar4 < fVar6) & (uint)fVar6 | ~-(uint)(fVar4 < fVar6) & (uint)fVar21
                      )) &&
           (cand_00.Min = (ImVec2)((ImGuiNavMoveResult *)nav_bb_arg)->Window,
           cand_00.Max.x = (float)((ImGuiNavMoveResult *)nav_bb_arg)->ID,
           cand_00.Max.y = (float)((ImGuiNavMoveResult *)nav_bb_arg)->FocusScopeId,
           bVar17 = NavScoreItem((ImGui *)&pIVar16->NavMoveResultLocalVisibleSet,result,cand_00),
           bVar17)) {
          (pIVar16->NavMoveResultLocalVisibleSet).Window = pIVar12;
          (pIVar16->NavMoveResultLocalVisibleSet).ID = id;
          (pIVar16->NavMoveResultLocalVisibleSet).FocusScopeId =
               (pIVar12->DC).NavFocusScopeIdCurrent;
          (pIVar16->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar23;
          (pIVar16->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar24;
          (pIVar16->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar19;
          (pIVar16->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar20;
        }
      }
    }
  }
  if (pIVar16->NavId == id) {
    pIVar16->NavWindow = pIVar12;
    IVar9 = (pIVar12->DC).NavLayerCurrent;
    pIVar16->NavLayer = IVar9;
    pIVar16->NavFocusScopeId = (pIVar12->DC).NavFocusScopeIdCurrent;
    pIVar16->NavIdIsAlive = true;
    pIVar16->NavIdTabCounter = (pIVar12->DC).FocusCounterTabStop;
    pIVar3 = pIVar12->NavRectRel + IVar9;
    (pIVar3->Min).x = fVar23;
    (pIVar3->Min).y = fVar24;
    (pIVar3->Max).x = fVar19;
    (pIVar3->Max).y = fVar20;
  }
LAB_0011b89e:
  (pIVar12->DC).LastItemId = id;
  IVar14 = bb->Max;
  (pIVar12->DC).LastItemRect.Min = bb->Min;
  (pIVar12->DC).LastItemRect.Max = IVar14;
  (pIVar12->DC).LastItemStatusFlags = 0;
  (pIVar16->NextItemData).Flags = 0;
  bVar17 = IsClippedEx(bb,id,false);
  if ((!bVar17) && (bVar18 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar18)) {
    pIVar2 = &(pIVar12->DC).LastItemStatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar17;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayerActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }

    // Equivalent to calling SetLastItemData()
    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}